

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::AssocArrayDeleteMethod::~AssocArrayDeleteMethod(AssocArrayDeleteMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~AssocArrayDeleteMethod((AssocArrayDeleteMethod *)0x8c2cf8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

AssocArrayDeleteMethod() :
        SystemSubroutine(KnownSystemName::Delete, SubroutineKind::Function) {}